

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::waitForResume(QFutureInterfaceBase *this)

{
  uint uVar1;
  QThreadPool *pool;
  long in_FS_OFFSET;
  ThreadPoolThreadReleaser releaser;
  ThreadPoolThreadReleaser local_30;
  undefined1 local_28 [24];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i;
  if ((char)((uVar1 & 8) >> 3) == '\0' && (uVar1 & 0x30) != 0) {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&this->d->m_mutex);
    uVar1 = (this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    if ((char)((uVar1 & 8) >> 3) == '\0' && (uVar1 & 0x30) != 0) {
      local_30.m_pool = (QThreadPool *)&DAT_aaaaaaaaaaaaaaaa;
      pool = QFutureInterfaceBasePrivate::pool(this->d);
      anon_unknown.dwarf_1090f56::ThreadPoolThreadReleaser::ThreadPoolThreadReleaser(&local_30,pool)
      ;
      QWaitCondition::wait(&this->d->pausedWaitCondition,this->d);
      anon_unknown.dwarf_1090f56::ThreadPoolThreadReleaser::~ThreadPoolThreadReleaser(&local_30);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::waitForResume()
{
    // return early if possible to avoid taking the mutex lock.
    {
        const int state = d->state.loadRelaxed();
        if (!(state & suspendingOrSuspended) || (state & Canceled))
            return;
    }

    QMutexLocker lock(&d->m_mutex);
    const int state = d->state.loadRelaxed();
    if (!(state & suspendingOrSuspended) || (state & Canceled))
        return;

    // decrease active thread count since this thread will wait.
    const ThreadPoolThreadReleaser releaser(d->pool());

    d->pausedWaitCondition.wait(&d->m_mutex);
}